

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

bool __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::CheckIfBoundAsRenderTarget
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,TextureImplType *pTexture)

{
  TextureViewGLImpl *pTVar1;
  Uint32 rt;
  ulong uVar2;
  bool bVar3;
  
  if (pTexture == (TextureImplType *)0x0) {
    bVar3 = false;
  }
  else {
    uVar2 = 0;
    while ((bVar3 = this->m_NumBoundRenderTargets != uVar2, bVar3 &&
           ((pTVar1 = this->m_pBoundRenderTargets[uVar2].m_pObject,
            pTVar1 == (TextureViewGLImpl *)0x0 ||
            ((TextureImplType *)
             (pTVar1->super_TextureViewBase<Diligent::EngineGLImplTraits>).m_pTexture != pTexture)))
           )) {
      uVar2 = uVar2 + 1;
    }
  }
  return bVar3;
}

Assistant:

bool DeviceContextBase<ImplementationTraits>::CheckIfBoundAsRenderTarget(TextureImplType* pTexture)
{
    if (pTexture == nullptr)
        return false;

    for (Uint32 rt = 0; rt < m_NumBoundRenderTargets; ++rt)
    {
        if (m_pBoundRenderTargets[rt] && m_pBoundRenderTargets[rt]->GetTexture() == pTexture)
        {
            return true;
        }
    }

    return false;
}